

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O2

void __thiscall
Gudhi::
Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>
::increment(Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>
            *this)

{
  reference ppVar1;
  pointer bg;
  Siblings *pSVar2;
  reverse_iterator rit;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
  *local_48;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
  *local_40;
  reverse_iterator<boost::container::vec_iterator<int_*,_false>_> local_38;
  
  pSVar2 = this->sib_;
  if (pSVar2 == (Siblings *)0x0) {
    (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)0x0;
  }
  else {
    local_40 = pSVar2->oncles_;
    local_38.m_current.m_ptr =
         (vec_iterator<int_*,_false>)
         ((long)&(this->suffix_).
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.super_static_storage_allocator<int,_40UL,_0UL,_true>.storage +
         (this->suffix_).
         super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
         .m_holder.m_size * 4);
    while (local_38.m_current.m_ptr != (vec_iterator<int_*,_false>)&this->suffix_) {
      boost::intrusive::reverse_iterator<boost::container::vec_iterator<int_*,_false>_>::operator*
                (&local_38);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
      ::find((Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
              *)&local_48,(Vertex_handle)pSVar2);
      (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)local_48;
      ppVar1 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
               ::operator*(&this->sh_);
      pSVar2 = (ppVar1->second).children_;
      boost::container::vec_iterator<int_*,_false>::operator--(&local_38.m_current);
    }
    Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
    ::find((Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles_fast_cofaces>_>,_std::less<int>,_void,_void>_>
            *)&local_48,(Vertex_handle)pSVar2);
    (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)local_48;
    boost::container::
    vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>::
    priv_push_back<int_const&>
              ((vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>
                *)&this->suffix_,&this->next_);
    this->next_ = this->sib_->parent_;
    this->sib_ = local_40;
  }
  return;
}

Assistant:

void increment() {
    if (sib_ == nullptr) {
      sh_ = st_->null_simplex();
      return;
    }

    Siblings const* for_sib = sib_;
    Siblings const* new_sib = sib_->oncles();
    auto rit = suffix_.rbegin();
    if constexpr (SimplexTree::Options::contiguous_vertices && !SimplexTree::Options::stable_simplex_handles) {
      if (new_sib == nullptr) {
        // We reached the root, use a short-cut to find a vertex.
        if (rit == suffix_.rend()) {
          // Segment, this vertex is the last boundary simplex
          sh_ = for_sib->members_.begin() + last_;
          sib_ = nullptr;
          return;
        } else {
          // Dim >= 2, initial step of the descent
          sh_ = for_sib->members_.begin() + *rit;
          for_sib = sh_->second.children();
          ++rit;
        }
      }
    }

    for (; rit != suffix_.rend(); ++rit) {
      sh_ = for_sib->find(*rit);
      for_sib = sh_->second.children();
    }
    sh_ = for_sib->find(last_);  // sh_ points to the right simplex now
    suffix_.push_back(next_);
    next_ = sib_->parent();
    sib_ = new_sib;
  }